

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void LinearSmoothing(double *input,double width,int fs,int fft_size,double *output)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint x_length;
  double *pdVar5;
  double *y;
  double *xi;
  ulong uVar6;
  double *pdVar7;
  double *yi;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint xi_length;
  ulong uVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  dVar17 = (double)fft_size;
  dVar18 = (double)fs;
  iVar12 = (int)((dVar17 * width) / dVar18);
  uVar4 = iVar12 + 1;
  uVar6 = (ulong)uVar4;
  iVar13 = fft_size / 2;
  iVar8 = iVar13 + iVar12 * 2 + 2;
  x_length = iVar13 + iVar12 * 2 + 3;
  uVar16 = (long)(int)x_length << 3;
  if (iVar8 < -1) {
    uVar16 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar16);
  y = (double *)operator_new__(uVar16);
  uVar16 = (long)iVar13 * 8 + 8;
  if (fft_size < -3) {
    uVar16 = 0xffffffffffffffff;
  }
  xi = (double *)operator_new__(uVar16);
  pdVar7 = pdVar5;
  if (-1 < iVar12) {
    do {
      *pdVar7 = input[uVar6];
      uVar6 = uVar6 - 1;
      pdVar7 = pdVar7 + 1;
    } while (uVar6 != 0);
  }
  iVar14 = uVar4 + iVar13;
  if (1 < fft_size) {
    uVar6 = (ulong)iVar12;
    lVar9 = (long)iVar14;
    if ((long)iVar14 < (long)(uVar6 + 2)) {
      lVar9 = uVar6 + 2;
    }
    memcpy(pdVar5 + uVar6 + 1,input,(~uVar6 + lVar9) * 8);
  }
  if (iVar12 < iVar12 * 2 + 2) {
    iVar15 = iVar14;
    if (iVar14 <= iVar8) {
      iVar15 = iVar8;
    }
    lVar9 = 0;
    iVar11 = iVar13;
    do {
      pdVar5[iVar14 + lVar9] = input[iVar11];
      lVar9 = lVar9 + 1;
      iVar11 = iVar11 + -1;
    } while ((iVar15 - iVar12) - iVar13 != (int)lVar9);
  }
  *y = (*pdVar5 * dVar18) / dVar17;
  if (0 < iVar8) {
    dVar1 = *y;
    uVar6 = 1;
    do {
      dVar1 = dVar1 + (pdVar5[uVar6] * dVar18) / dVar17;
      y[uVar6] = dVar1;
      uVar6 = uVar6 + 1;
    } while (x_length != uVar6);
  }
  auVar3 = _DAT_0010d3b0;
  auVar2 = _DAT_0010d320;
  xi_length = iVar13 + 1;
  uVar6 = (ulong)xi_length;
  if (-2 < fft_size) {
    lVar9 = uVar6 - 1;
    auVar19._8_4_ = (int)lVar9;
    auVar19._0_8_ = lVar9;
    auVar19._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar10 = 0;
    auVar19 = auVar19 ^ _DAT_0010d320;
    auVar20 = _DAT_0010d310;
    do {
      auVar21 = auVar20 ^ auVar2;
      auVar22._0_8_ = uVar10 & 0xffffffff;
      auVar22._8_4_ = (int)uVar10 + 1;
      auVar22._12_4_ = 0;
      auVar23._0_8_ = SUB168(auVar22 | auVar3,0) - auVar3._0_8_;
      auVar23._8_8_ = SUB168(auVar22 | auVar3,8) - auVar3._8_8_;
      auVar24._8_8_ = dVar17;
      auVar24._0_8_ = dVar17;
      auVar24 = divpd(auVar23,auVar24);
      if ((bool)(~(auVar21._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar21._0_4_ ||
                  auVar19._4_4_ < auVar21._4_4_) & 1)) {
        xi[uVar10] = auVar24._0_8_ * dVar18 + width * -0.5;
      }
      if ((auVar21._12_4_ != auVar19._12_4_ || auVar21._8_4_ <= auVar19._8_4_) &&
          auVar21._12_4_ <= auVar19._12_4_) {
        xi[uVar10 + 1] = auVar24._8_8_ * dVar18 + width * -0.5;
      }
      uVar10 = uVar10 + 2;
      lVar9 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 2;
      auVar20._8_8_ = lVar9 + 2;
    } while ((uVar6 + 1 & 0xfffffffffffffffe) != uVar10);
  }
  pdVar7 = (double *)operator_new__(uVar16);
  yi = (double *)operator_new__(uVar16);
  dVar1 = ((double)((ulong)((double)(int)uVar4 + -0.5) ^ (ulong)DAT_0010d3a0) * dVar18) / dVar17;
  dVar18 = dVar18 / dVar17;
  interp1Q(dVar1,dVar18,y,x_length,xi,xi_length,pdVar7);
  if (fft_size < -1) {
    interp1Q(dVar1,dVar18,y,x_length,xi,xi_length,yi);
  }
  else {
    uVar16 = 0;
    do {
      xi[uVar16] = xi[uVar16] + width;
      uVar16 = uVar16 + 1;
    } while (uVar6 != uVar16);
    interp1Q(dVar1,dVar18,y,x_length,xi,xi_length,yi);
    if (-2 < fft_size) {
      uVar16 = 0;
      do {
        output[uVar16] = (yi[uVar16] - pdVar7[uVar16]) / width;
        uVar16 = uVar16 + 1;
      } while (uVar6 != uVar16);
    }
  }
  operator_delete__(pdVar5);
  operator_delete__(y);
  operator_delete__(xi);
  operator_delete__(pdVar7);
  operator_delete__(yi);
  return;
}

Assistant:

void LinearSmoothing(const double *input, double width, int fs, int fft_size,
    double *output) {
  int boundary = static_cast<int>(width * fft_size / fs) + 1;

  // These parameters are set by the other function.
  double *mirroring_spectrum = new double[fft_size / 2 + boundary * 2 + 1];
  double *mirroring_segment = new double[fft_size / 2 + boundary * 2 + 1];
  double *frequency_axis = new double[fft_size / 2 + 1];
  SetParametersForLinearSmoothing(boundary, fft_size, fs, width,
      input, mirroring_spectrum, mirroring_segment, frequency_axis);

  double *low_levels = new double[fft_size / 2 + 1];
  double *high_levels = new double[fft_size / 2 + 1];
  double origin_of_mirroring_axis = -(boundary - 0.5) * fs / fft_size;
  double discrete_frequency_interval = static_cast<double>(fs) / fft_size;

  interp1Q(origin_of_mirroring_axis, discrete_frequency_interval,
      mirroring_segment, fft_size / 2 + boundary * 2 + 1, frequency_axis,
      fft_size / 2 + 1, low_levels);

  for (int i = 0; i <= fft_size / 2; ++i) frequency_axis[i] += width;

  interp1Q(origin_of_mirroring_axis, discrete_frequency_interval,
      mirroring_segment, fft_size / 2 + boundary * 2 + 1, frequency_axis,
      fft_size / 2 + 1, high_levels);

  for (int i = 0; i <= fft_size / 2; ++i)
    output[i] = (high_levels[i] - low_levels[i]) / width;

  delete[] mirroring_spectrum;
  delete[] mirroring_segment;
  delete[] frequency_axis;
  delete[] low_levels;
  delete[] high_levels;
}